

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_cparse.c
# Opt level: O0

void cp_save_grow(CPState *cp,CPChar c)

{
  uint uVar1;
  MSize nsz;
  void *pvVar2;
  MSize in_ESI;
  void *in_RDI;
  lua_State *unaff_retaddr;
  MSize newsize;
  ErrMsg in_stack_ffffffffffffffec;
  undefined4 in_stack_fffffffffffffff0;
  
  if (0x3fff < *(uint *)((long)in_RDI + 0x34)) {
    cp_err((CPState *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),in_stack_ffffffffffffffec);
  }
  nsz = *(int *)((long)in_RDI + 0x34) << 1;
  pvVar2 = lj_mem_realloc(unaff_retaddr,in_RDI,in_ESI,nsz);
  *(void **)((long)in_RDI + 0x28) = pvVar2;
  *(MSize *)((long)in_RDI + 0x34) = nsz;
  uVar1 = *(uint *)((long)in_RDI + 0x30);
  *(uint *)((long)in_RDI + 0x30) = uVar1 + 1;
  *(char *)(*(long *)((long)in_RDI + 0x28) + (ulong)uVar1) = (char)in_ESI;
  return;
}

Assistant:

static LJ_NOINLINE void cp_save_grow(CPState *cp, CPChar c)
{
  MSize newsize;
  if (cp->sb.sz >= CPARSE_MAX_BUF/2)
    cp_err(cp, LJ_ERR_XELEM);
  newsize = cp->sb.sz * 2;
  lj_str_resizebuf(cp->L, &cp->sb, newsize);
  cp->sb.buf[cp->sb.n++] = (char)c;
}